

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O2

size_t CBB_get_utf8_len(uint32_t u)

{
  undefined8 uStack_8;
  
  if (u < 0x80) {
    uStack_8 = 1;
  }
  else {
    if (0x7ff < u) {
      return 4 - (ulong)(u < 0x10000);
    }
    uStack_8 = 2;
  }
  return uStack_8;
}

Assistant:

size_t CBB_get_utf8_len(uint32_t u) {
  if (u <= 0x7f) {
    return 1;
  }
  if (u <= 0x7ff) {
    return 2;
  }
  if (u <= 0xffff) {
    return 3;
  }
  return 4;
}